

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeWindow(ImGuiWindow *window,char *label)

{
  uint uVar1;
  bool bVar2;
  char *label_00;
  char *pcVar3;
  char *pcVar4;
  undefined8 unaff_RBX;
  char *this;
  ImVec2 *unaff_RBP;
  ImGuiWindow *in_RSI;
  undefined8 *in_RDI;
  char *pcVar5;
  char *pcVar6;
  char *columns;
  char *pcVar7;
  ImVec2 *unaff_R14;
  char *label_01;
  ImVec2 IVar8;
  ImDrawList *unaff_retaddr;
  int n;
  ImGuiWindowFlags flags;
  bool open;
  char *in_stack_00000260;
  ImDrawList *in_stack_00000268;
  ImGuiWindow *in_stack_00000270;
  ImVec2 *in_stack_ffffffffffffff58;
  ImGuiHoveredFlags in_stack_ffffffffffffff60;
  ImGuiStorage *storage;
  uint local_78;
  byte local_3d;
  int local_3c;
  float in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar9;
  
  if (in_RDI == (undefined8 *)0x0) {
    BulletText("%s: NULL",in_RSI);
  }
  else {
    local_3d = 1;
    if ((*(byte *)((long)in_RDI + 0x7e) & 1) == 0) {
      local_3d = *(byte *)((long)in_RDI + 0x7f);
    }
    bVar2 = TreeNode((char *)in_RSI,"%s \'%s\', %d @ 0x%p",in_RSI,*in_RDI,(ulong)(local_3d & 1),
                     in_RDI);
    uVar9 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffd4);
    bVar2 = IsItemHovered(in_stack_ffffffffffffff60);
    if ((bVar2) && ((*(byte *)((long)in_RDI + 0x7f) & 1) != 0)) {
      GetForegroundDrawList();
      IVar8 = operator+(in_stack_ffffffffffffff58,(ImVec2 *)0x194995);
      in_stack_ffffffffffffffd0 = IVar8.y;
      ImDrawList::AddRect(unaff_retaddr,unaff_RBP,unaff_R14,(ImU32)((ulong)unaff_RBX >> 0x20),
                          (float)unaff_RBX,(ImDrawCornerFlags)((ulong)in_RDI >> 0x20),
                          SUB84(in_RDI,0));
    }
    if ((uVar9 & 0x1000000) != 0) {
      if ((*(byte *)((long)in_RDI + 0x7f) & 1) == 0) {
        TextDisabled("Note: window is not currently visible.");
      }
      if ((*(byte *)(in_RDI + 0x76) & 1) != 0) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
      }
      uVar1 = *(uint *)((long)in_RDI + 0xc);
      NodeDrawList(in_stack_00000270,in_stack_00000268,in_stack_00000260);
      BulletText((char *)(double)*(float *)(in_RDI + 2),(double)*(float *)((long)in_RDI + 0x14),
                 (double)*(float *)(in_RDI + 3),(double)*(float *)((long)in_RDI + 0x1c),
                 (double)*(float *)(in_RDI + 5),(double)*(float *)((long)in_RDI + 0x2c),
                 "Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)");
      pcVar4 = "";
      if ((uVar1 & 0x1000000) != 0) {
        pcVar4 = "Child ";
      }
      pcVar3 = "";
      if ((uVar1 & 0x2000000) != 0) {
        pcVar3 = "Tooltip ";
      }
      pcVar5 = "";
      if ((uVar1 & 0x4000000) != 0) {
        pcVar5 = "Popup ";
      }
      pcVar6 = "";
      if ((uVar1 & 0x8000000) != 0) {
        pcVar6 = "Modal ";
      }
      label_01 = "";
      if ((uVar1 & 0x10000000) != 0) {
        label_01 = "ChildMenu ";
      }
      this = "";
      if ((uVar1 & 0x100) != 0) {
        this = "NoSavedSettings ";
      }
      pcVar7 = "";
      if ((uVar1 & 0x200) != 0) {
        pcVar7 = "NoMouseInputs";
      }
      columns = "";
      if ((uVar1 & 0x40000) != 0) {
        columns = "NoNavInputs";
      }
      label_00 = "";
      if ((uVar1 & 0x40) != 0) {
        label_00 = "AlwaysAutoResize";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar1,pcVar4,pcVar3,pcVar5,pcVar6,
                 label_01,this,pcVar7);
      pcVar4 = "";
      if ((*(byte *)((long)in_RDI + 0x7c) & 1) != 0) {
        pcVar4 = "X";
      }
      pcVar3 = "";
      if ((*(byte *)((long)in_RDI + 0x7d) & 1) != 0) {
        pcVar3 = "Y";
      }
      BulletText((char *)(double)*(float *)((long)in_RDI + 0x54),
                 (double)*(float *)((long)in_RDI + 0x5c),(double)*(float *)(in_RDI + 0xb),
                 (double)*(float *)(in_RDI + 0xc),"Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",
                 pcVar4,pcVar3);
      if (((*(byte *)((long)in_RDI + 0x7e) & 1) == 0) && ((*(byte *)((long)in_RDI + 0x7f) & 1) == 0)
         ) {
        local_78 = 0xffffffff;
      }
      else {
        local_78 = (uint)*(short *)((long)in_RDI + 0x8e);
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)(*(byte *)((long)in_RDI + 0x7e) & 1),
                 (ulong)(*(byte *)((long)in_RDI + 0x7f) & 1),(ulong)(*(byte *)(in_RDI + 0x10) & 1),
                 (ulong)local_78);
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)(*(byte *)((long)in_RDI + 0x84) & 1),
                 (ulong)(*(byte *)((long)in_RDI + 0x85) & 1),(ulong)*(uint *)((long)in_RDI + 0x9c),
                 (ulong)*(uint *)(in_RDI + 0x14),(ulong)(*(byte *)((long)in_RDI + 0x83) & 1),
                 label_01,this,pcVar7);
      BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",(ulong)*(uint *)(in_RDI + 0x71)
                 ,(ulong)*(uint *)((long)in_RDI + 0x38c),(ulong)*(uint *)((long)in_RDI + 0x144));
      if (in_RDI[0x70] == 0) {
        storage = (ImGuiStorage *)0x1f8d20;
      }
      else {
        storage = *(ImGuiStorage **)in_RDI[0x70];
      }
      BulletText("NavLastChildNavWindow: %s",storage);
      bVar2 = ImRect::IsInverted((ImRect *)(in_RDI + 0x72));
      if (bVar2) {
        BulletText("NavRectRel[0]: <None>");
      }
      else {
        BulletText((char *)(double)*(float *)(in_RDI + 0x72),
                   (double)*(float *)((long)in_RDI + 0x394),(double)*(float *)(in_RDI + 0x73),
                   (double)*(float *)((long)in_RDI + 0x39c),"NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)")
        ;
      }
      if ((undefined8 *)in_RDI[0x6d] != in_RDI) {
        NodeWindow(in_RSI,(char *)CONCAT44(uVar9,in_stack_ffffffffffffffd0));
      }
      if (in_RDI[0x6c] != 0) {
        NodeWindow(in_RSI,(char *)CONCAT44(uVar9,in_stack_ffffffffffffffd0));
      }
      if (0 < *(int *)(in_RDI + 0x31)) {
        NodeWindows((ImVector<ImGuiWindow_*> *)this,label_01);
      }
      if ((0 < *(int *)(in_RDI + 0x53)) &&
         (bVar2 = TreeNode("Columns","Columns sets (%d)",(ulong)*(uint *)(in_RDI + 0x53)), bVar2)) {
        for (local_3c = 0; local_3c < *(int *)(in_RDI + 0x53); local_3c = local_3c + 1) {
          ImVector<ImGuiColumns>::operator[]
                    ((ImVector<ImGuiColumns> *)this,(int)((ulong)label_01 >> 0x20));
          NodeColumns((ImGuiColumns *)columns);
        }
        TreePop();
      }
      NodeStorage(storage,label_00);
      TreePop();
    }
  }
  return;
}

Assistant:

static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (window == NULL)
            {
                ImGui::BulletText("%s: NULL", label);
                return;
            }
            bool open = ImGui::TreeNode(label, "%s '%s', %d @ 0x%p", label, window->Name, (window->Active || window->WasActive), window);
            if (ImGui::IsItemHovered() && window->WasActive)
                ImGui::GetForegroundDrawList()->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!open)
                return;

            if (!window->WasActive)
                ImGui::TextDisabled("Note: window is not currently visible.");
            if (window->MemoryCompacted)
                ImGui::TextDisabled("Note: some memory buffers have been compacted/freed.");

            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    NodeColumns(&window->ColumnsStorage[n]);
                ImGui::TreePop();
            }
            NodeStorage(&window->StateStorage, "Storage");
            ImGui::TreePop();
        }